

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol_check_data.h
# Opt level: O0

void __thiscall
mp::VarInfoImpl<mp::VarVecRecomp>::apply_precision_options
          (VarInfoImpl<mp::VarVecRecomp> *this,int sol_rnd,int sol_prec)

{
  bool bVar1;
  iterator __lhs;
  iterator __rhs;
  reference pdVar2;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  double dVar3;
  double *x_1;
  iterator __end0_1;
  iterator __begin0_1;
  VarVecRecomp *__range4_1;
  double *x;
  iterator __end0;
  iterator __begin0;
  VarVecRecomp *__range4;
  double scale_rec;
  __type scale;
  VarVecRecomp *in_stack_ffffffffffffff68;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  *in_stack_ffffffffffffff70;
  iterator in_stack_ffffffffffffff78;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_60;
  long local_58;
  reference local_50;
  double *local_48;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_30;
  long local_28;
  double local_20;
  __type local_18;
  int local_10;
  
  local_10 = in_EDX;
  if (in_ESI < 100) {
    *(int *)(in_RDI + 0x118) = in_ESI;
    local_18 = std::pow<int,int>(0,0x16deaa);
    local_20 = 1.0 / local_18;
    local_28 = in_RDI + 0x10;
    local_30._M_current = (double *)VarVecRecomp::begin(in_stack_ffffffffffffff68);
    in_stack_ffffffffffffff78 = VarVecRecomp::end(in_stack_ffffffffffffff68);
    local_48 = in_stack_ffffffffffffff78._M_current;
    while (bVar1 = __gnu_cxx::operator!=
                             (in_stack_ffffffffffffff70,
                              (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                               *)in_stack_ffffffffffffff68), bVar1) {
      local_50 = __gnu_cxx::
                 __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                 operator*(&local_30);
      dVar3 = round(*local_50 * local_18);
      *local_50 = dVar3 * local_20;
      __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator++(&local_30);
    }
  }
  if (local_10 < 100) {
    *(int *)(in_RDI + 0x11c) = local_10;
    local_58 = in_RDI + 0x10;
    __lhs = VarVecRecomp::begin(in_stack_ffffffffffffff68);
    local_60._M_current = __lhs._M_current;
    __rhs = VarVecRecomp::end(in_stack_ffffffffffffff68);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                               *)__lhs._M_current,
                              (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                               *)__rhs._M_current), bVar1) {
      pdVar2 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator*(&local_60);
      dVar3 = round_to_digits<double>
                        ((double)in_stack_ffffffffffffff78._M_current,
                         (int)((ulong)__lhs._M_current >> 0x20));
      *pdVar2 = dVar3;
      __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator++(&local_60);
    }
  }
  return;
}

Assistant:

void apply_precision_options(
      int sol_rnd, int sol_prec) {
    try {                 // Apply sol_rnd
      if (sol_rnd<100) {
        sol_rnd_ = (sol_rnd);
        auto scale = std::pow(10, sol_rnd_);
        auto scale_rec = 1.0/scale;
        for (auto& x: x_)
          x = std::round(x * scale) * scale_rec;
      }
    } catch (...) { sol_rnd_=100; }     // Could add a warning
    try {                 // Apply sol_prec
      if (sol_prec<100) {
        sol_prec_ = (sol_prec);
        for (auto& x: x_)
          x = round_to_digits(x, sol_prec_);
      }
    } catch (...) { sol_prec_=100; }     // Could add a warning
  }